

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HwlocCpuInfo.cpp
# Opt level: O2

void xmrig::findCache<xmrig::HwlocCpuInfo::threads(unsigned_int)const::__0>
               (hwloc_obj_t obj,uint min,uint max,anon_class_8_1_4f99326f lambda)

{
  uint uVar1;
  bool bVar2;
  hwloc_obj *in_RAX;
  size_t i;
  ulong uVar3;
  hwloc_obj *local_38;
  
  uVar3 = 0;
  local_38 = in_RAX;
  do {
    if (obj->arity <= uVar3) {
      return;
    }
    bVar2 = isCacheObject(obj->children[uVar3]);
    if (bVar2) {
      uVar1 = (obj->children[uVar3]->attr->numanode).page_types_len;
      if (uVar1 <= max && min <= uVar1) {
        local_38 = obj->children[uVar3];
        std::vector<hwloc_obj*,std::allocator<hwloc_obj*>>::emplace_back<hwloc_obj*&>
                  ((vector<hwloc_obj*,std::allocator<hwloc_obj*>> *)lambda.caches,&local_38);
        goto LAB_0017f6bb;
      }
    }
    else {
LAB_0017f6bb:
      findCache<xmrig::HwlocCpuInfo::threads(unsigned_int)const::__0>
                (obj->children[uVar3],min,max,lambda);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static inline void findCache(hwloc_obj_t obj, unsigned min, unsigned max, func lambda)
{
    for (size_t i = 0; i < obj->arity; i++) {
        if (isCacheObject(obj->children[i])) {
            const unsigned depth = obj->children[i]->attr->cache.depth;
            if (depth < min || depth > max) {
                continue;
            }

            lambda(obj->children[i]);
        }

        findCache(obj->children[i], min, max, lambda);
    }
}